

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_wait(CURLM *multi_handle,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  ushort uVar1;
  ushort local_86;
  uint r;
  uint uStack_80;
  unsigned_short mask;
  uint j;
  curl_socket_t s_1;
  curl_socket_t s;
  long timeout_internal;
  pollfd *ufds;
  uint curlfds;
  uint nfds;
  uint i;
  int bitmap;
  curl_socket_t sockbunch [5];
  SessionHandle *data;
  Curl_multi *multi;
  int *ret_local;
  int timeout_ms_local;
  uint extra_nfds_local;
  curl_waitfd *extra_fds_local;
  CURLM *multi_handle_local;
  
  ufds._4_4_ = 0;
  timeout_internal = 0;
  if ((multi_handle == (CURLM *)0x0) || (*multi_handle != 0xbab1e)) {
    multi_handle_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    multi_timeout((Curl_multi *)multi_handle,(long *)&s_1);
    ret_local._0_4_ = timeout_ms;
    if ((-1 < _s_1) && (_s_1 < timeout_ms)) {
      ret_local._0_4_ = (uint)_s_1;
    }
    for (unique0x00012000 = *(SessionHandle **)((long)multi_handle + 8);
        stack0xffffffffffffffc0 != (SessionHandle *)0x0;
        unique0x00012000 = stack0xffffffffffffffc0->next) {
      nfds = multi_getsock(stack0xffffffffffffffc0,(curl_socket_t *)&i,5);
      for (curlfds = 0; curlfds < 5; curlfds = curlfds + 1) {
        j = 0xffffffff;
        if ((nfds & 1 << ((byte)curlfds & 0x1f)) != 0) {
          ufds._4_4_ = ufds._4_4_ + 1;
          j = (&i)[curlfds];
        }
        if ((nfds & 1 << ((byte)curlfds + 0x10 & 0x1f)) != 0) {
          ufds._4_4_ = ufds._4_4_ + 1;
          j = (&i)[curlfds];
        }
        if (j == 0xffffffff) break;
      }
    }
    ufds._0_4_ = ufds._4_4_;
    ufds._4_4_ = extra_nfds + ufds._4_4_;
    if (((ufds._4_4_ == 0) && (extra_nfds == 0)) ||
       (timeout_internal = (long)(*Curl_cmalloc)((ulong)ufds._4_4_ << 3),
       (void *)timeout_internal != (void *)0x0)) {
      ufds._4_4_ = 0;
      if ((int)ufds != 0) {
        for (unique0x00012000 = *(SessionHandle **)((long)multi_handle + 8);
            stack0xffffffffffffffc0 != (SessionHandle *)0x0;
            unique0x00012000 = stack0xffffffffffffffc0->next) {
          nfds = multi_getsock(stack0xffffffffffffffc0,(curl_socket_t *)&i,5);
          for (curlfds = 0; curlfds < 5; curlfds = curlfds + 1) {
            uStack_80 = 0xffffffff;
            if ((nfds & 1 << ((byte)curlfds & 0x1f)) != 0) {
              *(uint *)(timeout_internal + (ulong)ufds._4_4_ * 8) = (&i)[curlfds];
              *(undefined2 *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) = 1;
              ufds._4_4_ = ufds._4_4_ + 1;
              uStack_80 = (&i)[curlfds];
            }
            if ((nfds & 1 << ((byte)curlfds + 0x10 & 0x1f)) != 0) {
              *(uint *)(timeout_internal + (ulong)ufds._4_4_ * 8) = (&i)[curlfds];
              *(undefined2 *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) = 4;
              ufds._4_4_ = ufds._4_4_ + 1;
              uStack_80 = (&i)[curlfds];
            }
            if (uStack_80 == 0xffffffff) break;
          }
        }
      }
      for (curlfds = 0; curlfds < extra_nfds; curlfds = curlfds + 1) {
        *(curl_socket_t *)(timeout_internal + (ulong)ufds._4_4_ * 8) = extra_fds[curlfds].fd;
        *(undefined2 *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) = 0;
        if ((extra_fds[curlfds].events & 1U) != 0) {
          *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) =
               *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) | 1;
        }
        if ((extra_fds[curlfds].events & 2U) != 0) {
          *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) =
               *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) | 2;
        }
        if ((extra_fds[curlfds].events & 4U) != 0) {
          *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) =
               *(ushort *)(timeout_internal + 4 + (ulong)ufds._4_4_ * 8) | 4;
        }
        ufds._4_4_ = ufds._4_4_ + 1;
      }
      if (ufds._4_4_ == 0) {
        curlfds = 0;
      }
      else {
        Curl_infof(stack0xffffffffffffffc0,"Curl_poll(%d ds, %d ms)\n",(ulong)ufds._4_4_,
                   (ulong)(uint)ret_local);
        curlfds = Curl_poll((pollfd *)timeout_internal,ufds._4_4_,(uint)ret_local);
        if (curlfds != 0) {
          for (r = 0; r < extra_nfds; r = r + 1) {
            uVar1 = *(ushort *)(timeout_internal + 6 + (ulong)((int)ufds + r) * 8);
            local_86 = (ushort)((uVar1 & 1) != 0);
            if ((uVar1 & 4) != 0) {
              local_86 = local_86 | 4;
            }
            if ((uVar1 & 2) != 0) {
              local_86 = local_86 | 2;
            }
            extra_fds[r].revents = local_86;
          }
        }
      }
      if (timeout_internal != 0) {
        (*Curl_cfree)((void *)timeout_internal);
      }
      if (ret != (int *)0x0) {
        *ret = curlfds;
      }
      multi_handle_local._4_4_ = CURLM_OK;
    }
    else {
      multi_handle_local._4_4_ = CURLM_OUT_OF_MEMORY;
    }
  }
  return multi_handle_local._4_4_;
}

Assistant:

CURLMcode curl_multi_wait(CURLM *multi_handle,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    /* wait... */
    infof(data, "Curl_poll(%d ds, %d ms)\n", nfds, timeout_ms);
    i = Curl_poll(ufds, nfds, timeout_ms);

    if(i) {
      unsigned int j;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(j = 0; j < extra_nfds; j++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + j].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[j].revents = mask;
      }
    }
  }
  else
    i = 0;

  Curl_safefree(ufds);
  if(ret)
    *ret = i;
  return CURLM_OK;
}